

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_img_decompress_header(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  bool bVar1;
  int iVar2;
  int *in_RDX;
  fitsfile *in_RSI;
  fitsfile *in_RDI;
  bool bVar3;
  long naxes [6];
  int *in_stack_00000030;
  int bitpix;
  int naxis;
  int ii;
  char card [81];
  int tstatus;
  int norec;
  int copyprime;
  int nullprime;
  int numkeys;
  int inhdupos;
  int hdupos;
  int writeprime;
  int *in_stack_00000460;
  int in_stack_0000046c;
  fitsfile *in_stack_00000470;
  fitsfile *in_stack_00000478;
  fitsfile *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  fitsfile *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  fitsfile *in_stack_ffffffffffffff58;
  int local_a0;
  int local_9c;
  int *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  fitsfile *in_stack_ffffffffffffffa8;
  int local_30;
  int local_2c;
  int local_28;
  uint local_24;
  int *local_20;
  fitsfile *local_18;
  fitsfile *local_10;
  int local_4;
  
  bVar1 = false;
  bVar3 = false;
  if (*in_RDX < 1) {
    iVar2 = *in_RDX;
    if (iVar2 == -1) {
      *in_RDX = 0;
    }
    local_24 = (uint)(iVar2 == -1);
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar2 = fits_is_compressed_image(in_stack_ffffffffffffff28,(int *)0x1fb68b);
    if (iVar2 == 0) {
      ffpmsg((char *)0x1fb69c);
      *local_20 = 0x19e;
      local_4 = 0x19e;
    }
    else {
      ffghdn(local_10,&local_2c);
      ffghdn(local_18,&local_28);
      ffghsp(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             &in_stack_ffffffffffffff28->HDUposition,(int *)0x1fb705);
      iVar2 = ffgcrd((fitsfile *)card._24_8_,(char *)card._16_8_,(char *)card._8_8_,
                     (int *)card._0_8_);
      if ((iVar2 == 0) && (local_28 == 1)) {
        if (local_30 == 0) {
          bVar1 = true;
        }
        else {
          ffgipr(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                 &in_stack_ffffffffffffff38->HDUposition,in_stack_ffffffffffffff30,
                 (long *)in_stack_ffffffffffffff28,(int *)0x1fb77e);
          if (local_a0 == 0) {
            bVar1 = true;
            bVar3 = local_2c == 2;
          }
        }
      }
      if (bVar1) {
        for (local_9c = local_30; 0 < local_9c; local_9c = local_9c + -1) {
          ffdrec((fitsfile *)card._72_8_,card._68_4_,(int *)card._56_8_);
        }
      }
      else {
        iVar2 = ffgcrd((fitsfile *)card._24_8_,(char *)card._16_8_,(char *)card._8_8_,
                       (int *)card._0_8_);
        if (iVar2 == 0) {
          if (local_24 == 0) {
            if (local_30 == 0) {
              ffcrim(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                     (long *)in_stack_ffffffffffffff48,
                     (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
              iVar2 = ffcrhd(in_stack_ffffffffffffff48,
                             (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
              if (0 < iVar2) {
                ffpmsg((char *)0x1fb989);
                return *local_20;
              }
            }
            else {
              ffcrhd(in_stack_ffffffffffffff48,
                     (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            }
          }
          else {
            iVar2 = ffcrim(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                           in_stack_ffffffffffffff50,(long *)in_stack_ffffffffffffff48,
                           (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
            if (0 < iVar2) {
              ffpmsg((char *)0x1fb917);
              return *local_20;
            }
          }
        }
        else {
          iVar2 = ffcrim(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                         in_stack_ffffffffffffff50,(long *)in_stack_ffffffffffffff48,
                         (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
          if (0 < iVar2) {
            ffpmsg((char *)0x1fb886);
            return *local_20;
          }
        }
      }
      if (*local_20 < 1) {
        iVar2 = imcomp_copy_comp2img
                          (in_stack_00000478,in_stack_00000470,in_stack_0000046c,in_stack_00000460);
        if (0 < iVar2) {
          ffpmsg((char *)0x1fba20);
        }
        if (bVar3) {
          ffmahd(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90);
          ffrdef(_naxis,in_stack_00000030);
          iVar2 = imcomp_copy_prime2img((fitsfile *)naxes[5],(fitsfile *)naxes[4],(int *)naxes[3]);
          if (0 < iVar2) {
            ffpmsg((char *)0x1fba8b);
          }
          ffmahd(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90);
        }
        local_4 = *local_20;
      }
      else {
        ffpmsg((char *)0x1fb9d5);
        local_4 = *local_20;
      }
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int fits_img_decompress_header(fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  This routine reads the header of the input tile compressed image and 
  converts it to that of a standard uncompress FITS image.
*/

{
    int writeprime = 0;
    int hdupos, inhdupos, numkeys;
    int nullprime = 0, copyprime = 0, norec = 0, tstatus;
    char card[FLEN_CARD];
    int ii, naxis, bitpix;
    long naxes[MAX_COMPRESS_DIM];

    if (*status > 0)
        return(*status);
    else if (*status == -1) {
        *status = 0;
	writeprime = 1;
    }

    if (!fits_is_compressed_image(infptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_img_decompress)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* get information about the state of the output file; does it already */
    /* contain any keywords and HDUs?  */
    fits_get_hdu_num(infptr, &inhdupos);  /* Get the current output HDU position */
    fits_get_hdu_num(outfptr, &hdupos);  /* Get the current output HDU position */
    fits_get_hdrspace(outfptr, &numkeys, 0, status);

    /* Was the input compressed HDU originally the primary array image? */
    tstatus = 0;
    if (!fits_read_card(infptr, "ZSIMPLE", card, &tstatus)) { 
      /* yes, input HDU was a primary array (not an IMAGE extension) */
      /* Now determine if we can uncompress it into the primary array of */
      /* the output file.  This is only possible if the output file */
      /* currently only contains a null primary array, with no addition */
      /* header keywords and with no following extension in the FITS file. */
      
      if (hdupos == 1) {  /* are we positioned at the primary array? */
            if (numkeys == 0) { /* primary HDU is completely empty */
	        nullprime = 1;
            } else {
                fits_get_img_param(outfptr, MAX_COMPRESS_DIM, &bitpix, &naxis, naxes, status);
	
	        if (naxis == 0) { /* is this a null image? */
                   nullprime = 1;

		   if (inhdupos == 2)  /* must be at the first extension */
		      copyprime = 1;
		}
           }
      }
    } 

    if (nullprime) {  
       /* We will delete the existing keywords in the null primary array
          and uncompress the input image into the primary array of the output.
	  Some of these keywords may be added back to the uncompressed image
	  header later.
       */

       for (ii = numkeys; ii > 0; ii--)
          fits_delete_record(outfptr, ii, status);

    } else  {

       /* if the ZTENSION keyword doesn't exist, then we have to 
          write the required keywords manually */
       tstatus = 0;
       if (fits_read_card(infptr, "ZTENSION", card, &tstatus)) {

          /* create an empty output image with the correct dimensions */
          if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
             (infptr->Fptr)->znaxis, status) > 0)
          {
             ffpmsg("error creating output decompressed image HDU");
    	     return (*status);
          }

	  norec = 1;  /* the required keywords have already been written */

       } else {  /* the input compressed image does have ZTENSION keyword */
       
          if (writeprime) {  /* convert the image extension to a primary array */
	      /* have to write the required keywords manually */

              /* create an empty output image with the correct dimensions */
              if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
                 (infptr->Fptr)->znaxis, status) > 0)
              {
                 ffpmsg("error creating output decompressed image HDU");
    	         return (*status);
              }

	      norec = 1;  /* the required keywords have already been written */

          } else {  /* write the input compressed image to an image extension */

              if (numkeys == 0) {  /* the output file is currently completely empty */
	  
	         /* In this case, the input is a compressed IMAGE extension. */
	         /* Since the uncompressed output file is currently completely empty, */
	         /* we need to write a null primary array before uncompressing the */
                 /* image extension */
	     
                 ffcrim(outfptr, 8, 0, naxes, status); /* naxes is not used */
	     
	         /* now create the empty extension to uncompress into */
                 if (fits_create_hdu(outfptr, status) > 0)
                 {
                      ffpmsg("error creating output decompressed image HDU");
    	              return (*status);
                 }
	  
	      } else {
                  /* just create a new empty extension, then copy all the required */
	          /* keywords into it.  */
                 fits_create_hdu(outfptr, status);
	      }
           }
       }

    }

    if (*status > 0)  {
        ffpmsg("error creating output decompressed image HDU");
    	return (*status);
    }

    /* Copy the table header to the image header. */

    if (imcomp_copy_comp2img(infptr, outfptr, norec, status) > 0)
    {
        ffpmsg("error copying header keywords from compressed image");
    }

    if (copyprime) {  
	/* append any unexpected keywords from the primary array.
	   This includes any keywords except SIMPLE, BITPIX, NAXIS,
	   EXTEND, COMMENT, HISTORY, CHECKSUM, and DATASUM.
	*/

        fits_movabs_hdu(infptr, 1, NULL, status);  /* move to primary array */
	
        /* do this so that any new keywords get written before any blank
	   keywords that may have been appended by imcomp_copy_comp2img  */
        fits_set_hdustruc(outfptr, status);

        if (imcomp_copy_prime2img(infptr, outfptr, status) > 0)
        {
            ffpmsg("error copying primary keywords from compressed file");
        }

        fits_movabs_hdu(infptr, 2, NULL, status); /* move back to where we were */
    }

    return (*status);
}